

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::~ArrayBuilder
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this)

{
  FlattenedField *pFVar1;
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *pRVar2;
  FlattenedField *pFVar3;
  
  pFVar1 = this->ptr;
  if (pFVar1 != (FlattenedField *)0x0) {
    pRVar2 = this->pos;
    pFVar3 = this->endPtr;
    this->ptr = (FlattenedField *)0x0;
    this->pos = (RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)0x0;
    this->endPtr = (FlattenedField *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pFVar1,0xb8,((long)pRVar2 - (long)pFVar1 >> 3) * -0x2c8590b21642c859,
               ((long)pFVar3 - (long)pFVar1 >> 3) * -0x2c8590b21642c859,
               ArrayDisposer::Dispose_<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::destruct
              );
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }